

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::TryOptConstFoldBrGreaterThan
          (GlobOpt *this,Instr *instr,bool branchOnGreaterThan,Value *src1Value,int32 min1,
          int32 max1,Value *src2Value,int32 min2,int32 max2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ValueType *pVVar4;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2818,"(instr)","instr");
    if (!bVar2) goto LAB_004692f6;
    *puVar3 = 0;
  }
  if (src1Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2819,"(src1Value)","src1Value");
    if (!bVar2) goto LAB_004692f6;
    *puVar3 = 0;
  }
  pVVar4 = &src1Value->valueInfo->super_ValueType;
  if ((this->field_0xf5 & 2) == 0) {
    bVar2 = ValueType::IsInt(pVVar4);
  }
  else {
    bVar2 = ValueType::IsLikelyInt(pVVar4);
  }
  if (bVar2 == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x281a,
                       "(DoAggressiveIntTypeSpec() ? src1Value->GetValueInfo()->IsLikelyInt() : src1Value->GetValueInfo()->IsInt())"
                       ,
                       "DoAggressiveIntTypeSpec() ? src1Value->GetValueInfo()->IsLikelyInt() : src1Value->GetValueInfo()->IsInt()"
                      );
    if (!bVar2) goto LAB_004692f6;
    *puVar3 = 0;
  }
  if (src2Value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x281b,"(src2Value)","src2Value");
    if (!bVar2) goto LAB_004692f6;
    *puVar3 = 0;
  }
  pVVar4 = &src2Value->valueInfo->super_ValueType;
  if ((this->field_0xf5 & 2) == 0) {
    bVar2 = ValueType::IsInt(pVVar4);
  }
  else {
    bVar2 = ValueType::IsLikelyInt(pVVar4);
  }
  if (bVar2 == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x281c,
                       "(DoAggressiveIntTypeSpec() ? src2Value->GetValueInfo()->IsLikelyInt() : src2Value->GetValueInfo()->IsInt())"
                       ,
                       "DoAggressiveIntTypeSpec() ? src2Value->GetValueInfo()->IsLikelyInt() : src2Value->GetValueInfo()->IsInt()"
                      );
    if (!bVar2) {
LAB_004692f6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = ValueInfo::IsGreaterThan(src1Value,min1,max1,src2Value,min2,max2);
  if (!bVar2) {
    bVar2 = ValueInfo::IsLessThanOrEqualTo(src1Value,min1,max1,src2Value,min2,max2);
    if (!bVar2) {
      return false;
    }
    branchOnGreaterThan = !branchOnGreaterThan;
  }
  OptConstFoldBr(this,branchOnGreaterThan,instr,src1Value,src2Value);
  return true;
}

Assistant:

bool
GlobOpt::TryOptConstFoldBrGreaterThan(
    IR::Instr *const instr,
    const bool branchOnGreaterThan,
    Value *const src1Value,
    const int32 min1,
    const int32 max1,
    Value *const src2Value,
    const int32 min2,
    const int32 max2)
{
    Assert(instr);
    Assert(src1Value);
    Assert(DoAggressiveIntTypeSpec() ? src1Value->GetValueInfo()->IsLikelyInt() : src1Value->GetValueInfo()->IsInt());
    Assert(src2Value);
    Assert(DoAggressiveIntTypeSpec() ? src2Value->GetValueInfo()->IsLikelyInt() : src2Value->GetValueInfo()->IsInt());

    if(ValueInfo::IsGreaterThan(src1Value, min1, max1, src2Value, min2, max2))
    {
        OptConstFoldBr(branchOnGreaterThan, instr, src1Value, src2Value);
        return true;
    }
    if(ValueInfo::IsLessThanOrEqualTo(src1Value, min1, max1, src2Value, min2, max2))
    {
        OptConstFoldBr(!branchOnGreaterThan, instr, src1Value, src2Value);
        return true;
    }
    return false;
}